

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzer.cpp
# Opt level: O1

void __thiscall SWDAnalyzer::SetupResults(SWDAnalyzer *this)

{
  SWDAnalyzerResults *pSVar1;
  SWDAnalyzerResults *this_00;
  
  this_00 = (SWDAnalyzerResults *)operator_new(0x20);
  SWDAnalyzerResults::SWDAnalyzerResults(this_00,this,&this->mSettings);
  pSVar1 = (this->mResults)._M_ptr;
  if (pSVar1 != this_00) {
    if (pSVar1 != (SWDAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pSVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void SWDAnalyzer::SetupResults()
{
    // reset the results
    mResults.reset( new SWDAnalyzerResults( this, &mSettings ) );
    SetAnalyzerResults( mResults.get() );

    // set which channels will carry bubbles
    mResults->AddChannelBubblesWillAppearOn( mSettings.mSWDIO );
    mResults->AddChannelBubblesWillAppearOn( mSettings.mSWCLK );
}